

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.h
# Opt level: O1

void __thiscall
kj::Function<void_()>::
Impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++:89:30)>
::operator()(Impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_mutex_test_c__:89:30)>
             *this)

{
  MutexGuarded<unsigned_int> *pMVar1;
  MonotonicClock *pMVar2;
  Quantity<long,_kj::_::NanosecondLabel> duration;
  Maybe<kj::Locked<unsigned_int>_> maybeLock;
  DebugComparison<kj::Maybe<kj::Locked<unsigned_int>_>_&,_const_kj::None_&> _kjCondition;
  Quantity<long,_kj::_::NanosecondLabel> timeout;
  undefined1 local_60 [24];
  uint *local_48;
  DebugComparison<kj::Maybe<kj::Locked<unsigned_int>_>_&,_const_kj::None_&> local_40;
  long local_18;
  
  local_18 = 8000000;
  pMVar1 = (this->f).value;
  local_40.left = (Maybe<kj::Locked<unsigned_int>_> *)CONCAT71(local_40.left._1_7_,1);
  local_40.right = (None *)0x7a1200;
  local_60[8] = _::Mutex::lock(&pMVar1->mutex);
  if ((bool)local_60[8]) {
    local_48 = &pMVar1->value;
    local_60._16_8_ = pMVar1;
  }
  pMVar2 = systemPreciseMonotonicClock();
  local_60._0_8_ = (*(code *)**(undefined8 **)pMVar2)(pMVar2);
  local_60._0_8_ = local_60._0_8_ - (((this->f).threadStartTime)->value).value;
  local_40.left = (Maybe<kj::Locked<unsigned_int>_> *)(local_60 + 8);
  local_40.result = (bool)(local_60[8] ^ 1);
  local_40.right = (None *)&none;
  local_40.op.content.ptr = " == ";
  local_40.op.content.size_ = 5;
  if ((local_60[8] != 0) && (_::Debug::minSeverity < 3)) {
    _::Debug::
    log<char_const(&)[39],kj::_::DebugComparison<kj::Maybe<kj::Locked<unsigned_int>>&,kj::None_const&>&,kj::Quantity<long,kj::_::NanosecondLabel>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++"
               ,0x5e,ERROR,"\"failed: expected \" \"maybeLock == kj::none\", _kjCondition, duration"
               ,(char (*) [39])"failed: expected maybeLock == kj::none",&local_40,
               (Quantity<long,_kj::_::NanosecondLabel> *)local_60);
  }
  local_40.left = (Maybe<kj::Locked<unsigned_int>_> *)local_60;
  local_40.right = (None *)&local_18;
  local_40.op.content.ptr = " >= ";
  local_40.op.content.size_ = 5;
  local_40.result = local_18 <= (long)local_60._0_8_;
  if (((long)local_60._0_8_ < local_18) && (_::Debug::minSeverity < 3)) {
    _::Debug::
    log<char_const(&)[37],kj::_::DebugComparison<kj::Quantity<long,kj::_::NanosecondLabel>&,kj::Quantity<long,kj::_::NanosecondLabel>&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++"
               ,0x5f,ERROR,"\"failed: expected \" \"duration >= timeout\", _kjCondition",
               (char (*) [37])"failed: expected duration >= timeout",
               (DebugComparison<kj::Quantity<long,_kj::_::NanosecondLabel>_&,_kj::Quantity<long,_kj::_::NanosecondLabel>_&>
                *)&local_40);
  }
  if ((local_60[8] == 1) &&
     ((MutexGuarded<unsigned_int> *)local_60._16_8_ != (MutexGuarded<unsigned_int> *)0x0)) {
    _::Mutex::unlock((Mutex *)local_60._16_8_,EXCLUSIVE,(Waiter *)0x0);
  }
  return;
}

Assistant:

Return operator()(Params... params) override {
      return f(kj::fwd<Params>(params)...);
    }